

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

void __thiscall tokenizer::read_string(tokenizer *this)

{
  bool bVar1;
  bool gotEndQuote;
  tokenizer *this_local;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (&this->current_word,'\"');
  bVar1 = false;
  this->last_position_number = this->position_number;
  this->last_line_number = this->line_number;
  do {
    if (*this->line_char == '\0') {
LAB_001153ae:
      if (bVar1) {
        add_token_to_stream(this,string);
      }
      else {
        add_token_to_stream(this,invalid);
      }
      advance_to_next_character(this);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&this->current_word,"");
      return;
    }
    if (*this->line_char == '\"') {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (&this->current_word,'\"');
      bVar1 = true;
      goto LAB_001153ae;
    }
    if ((*this->line_char == '\\') && (this->line_char[1] == '\"')) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (&this->current_word,'\"');
      advance_to_next_character(this);
      advance_to_next_character(this);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (&this->current_word,*this->line_char);
      advance_to_next_character(this);
    }
  } while( true );
}

Assistant:

void tokenizer::read_string() {
    current_word += '"';
    bool gotEndQuote = false;

    last_position_number = position_number;
    last_line_number = line_number;

    while(*line_char != '\0') {
        if(*line_char == '"') {
            current_word += '"';
            gotEndQuote = true;
            break;
        }
        else if(*line_char == '\\' && *(line_char + 1) == '"') {
            current_word += '"';
            this->advance_to_next_character();
            this->advance_to_next_character();
        }
        else {
            current_word += *line_char;
            this->advance_to_next_character();
        }
    }

    if(gotEndQuote) {
        this->add_token_to_stream(Token_Type::string);
    }
    else {
        this->add_token_to_stream(Token_Type::invalid);
    }

    this->advance_to_next_character();
    //position_number += current_word.length() + 3;
    current_word = "";
}